

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_local_time * mg_local_time_copy_ca(mg_local_time *src,mg_allocator *allocator)

{
  mg_local_time *pmVar1;
  
  if (src != (mg_local_time *)0x0) {
    pmVar1 = (mg_local_time *)mg_allocator_malloc(allocator,8);
    if (pmVar1 == (mg_local_time *)0x0) {
      pmVar1 = (mg_local_time *)0x0;
    }
    else {
      pmVar1->nanoseconds = src->nanoseconds;
    }
    return pmVar1;
  }
  return (mg_local_time *)0x0;
}

Assistant:

mg_local_time *mg_local_time_copy_ca(const mg_local_time *src,
                                     mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_local_time *local_time = mg_local_time_alloc(allocator);
  if (!local_time) {
    return NULL;
  }
  memcpy(local_time, src, sizeof(mg_local_time));
  return local_time;
}